

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AcknowledgeReliablePdu.cpp
# Opt level: O0

bool __thiscall
DIS::AcknowledgeReliablePdu::operator==(AcknowledgeReliablePdu *this,AcknowledgeReliablePdu *rhs)

{
  bool local_19;
  bool ivarsEqual;
  AcknowledgeReliablePdu *rhs_local;
  AcknowledgeReliablePdu *this_local;
  
  local_19 = SimulationManagementWithReliabilityFamilyPdu::operator==
                       (&this->super_SimulationManagementWithReliabilityFamilyPdu,
                        &rhs->super_SimulationManagementWithReliabilityFamilyPdu);
  if (this->_acknowledgeFlag != rhs->_acknowledgeFlag) {
    local_19 = false;
  }
  if (this->_responseFlag != rhs->_responseFlag) {
    local_19 = false;
  }
  if (this->_requestID != rhs->_requestID) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool AcknowledgeReliablePdu::operator ==(const AcknowledgeReliablePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = SimulationManagementWithReliabilityFamilyPdu::operator==(rhs);

     if( ! (_acknowledgeFlag == rhs._acknowledgeFlag) ) ivarsEqual = false;
     if( ! (_responseFlag == rhs._responseFlag) ) ivarsEqual = false;
     if( ! (_requestID == rhs._requestID) ) ivarsEqual = false;

    return ivarsEqual;
 }